

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::Render(Element *this)

{
  bool bVar1;
  reference ppEVar2;
  Element *element;
  iterator __end1;
  iterator __begin1;
  ElementList *__range1;
  Element *this_local;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if ((this->stacking_context_dirty & 1U) != 0) {
    BuildLocalStackingContext(this);
  }
  UpdateTransformState(this);
  ElementUtilities::ApplyTransform(this);
  ElementEffects::RenderEffects(&this->meta->effects,Enter);
  bVar1 = ElementUtilities::SetClippingRegion(this,false);
  if (bVar1) {
    ElementBackgroundBorder::Render(&this->meta->background_border,this);
    ElementEffects::RenderEffects(&this->meta->effects,Decoration);
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xb])();
  }
  __end1 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::begin
                     (&this->stacking_context);
  element = (Element *)
            ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                      (&this->stacking_context);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                                     *)&element), bVar1) {
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
              ::operator*(&__end1);
    Render(*ppEVar2);
    __gnu_cxx::
    __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
    ::operator++(&__end1);
  }
  ElementEffects::RenderEffects(&this->meta->effects,Exit);
  return;
}

Assistant:

void Element::Render()
{
#ifdef RMLUI_TRACY_PROFILING
	auto name = GetAddress(false, false);
	RMLUI_ZoneScoped;
	RMLUI_ZoneText(name.c_str(), name.size());
#endif

	UpdateAbsoluteOffsetAndRenderBoxData();

	// Rebuild our stacking context if necessary.
	if (stacking_context_dirty)
		BuildLocalStackingContext();

	UpdateTransformState();

	// Apply our transform
	ElementUtilities::ApplyTransform(*this);

	meta->effects.RenderEffects(RenderStage::Enter);

	// Set up the clipping region for this element.
	if (ElementUtilities::SetClippingRegion(this))
	{
		meta->background_border.Render(this);
		meta->effects.RenderEffects(RenderStage::Decoration);

		{
			RMLUI_ZoneScopedNC("OnRender", 0x228B22);

			OnRender();
		}
	}

	// Render all elements in our local stacking context.
	for (Element* element : stacking_context)
		element->Render();

	meta->effects.RenderEffects(RenderStage::Exit);
}